

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O1

void * crazyOpen(char *URI)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  if ((URI != (char *)0x0) && (iVar1 = strncmp(URI,"crazy:",6), iVar1 == 0)) {
    uVar3 = (ulong)crazy_indx;
    sVar2 = strlen(crazy);
    if (sVar2 < uVar3) {
      return (void *)0x0;
    }
    timeout = 0;
    t0 = clock();
    rlen = crazy_indx;
    current = crazy;
    instate = 0;
    return crazy;
  }
  return (void *)0x0;
}

Assistant:

static void *
crazyOpen(const char * URI) {
    if ((URI == NULL) || (strncmp(URI, "crazy:", 6)))
        return(NULL);

    if (crazy_indx > strlen(crazy))
        return(NULL);
    reset_timout();
    rlen = crazy_indx;
    current = &crazy[0];
    instate = 0;
    return((void *) current);
}